

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

string * __thiscall
duckdb::CastExceptionText<unsigned_short,unsigned_char>
          (string *__return_storage_ptr__,duckdb *this,unsigned_short input)

{
  PhysicalType type;
  string sStack_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  TypeIdToString_abi_cxx11_(&local_38,(duckdb *)0x4,(PhysicalType)input);
  ::std::operator+(&local_b8,"Type ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
  ::std::operator+(&local_98,&local_b8," with value ");
  ConvertToString::Operation<unsigned_short>(&local_d8,(uint16_t)this);
  ::std::operator+(&local_78,&local_98,&local_d8);
  ::std::operator+(&local_58,&local_78,
                   " can\'t be cast because the value is out of range for the destination type ");
  TypeIdToString_abi_cxx11_(&sStack_f8,(duckdb *)0x2,type);
  ::std::operator+(__return_storage_ptr__,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_f8);
  ::std::__cxx11::string::~string((string *)&sStack_f8);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}